

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

StructText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeStructText
          (StructText *__return_storage_ptr__,CapnpcCppMain *this,StringPtr scope,StringPtr name,
          StructSchema schema,Array<kj::StringTree> nestedTypeDecls,TemplateContext *templateContext
          )

{
  undefined8 *puVar1;
  uint i;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  ArrayDisposer *pAVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  Branch *pBVar9;
  Field field;
  Reader proto_00;
  Reader proto_01;
  StringPtr hexId_00;
  undefined8 uVar10;
  undefined1 auVar11 [8];
  undefined8 uVar12;
  Impl *pIVar13;
  undefined2 uVar14;
  int iVar15;
  Branch *pBVar16;
  size_t *psVar17;
  StringTree *pSVar18;
  undefined4 extraout_var;
  StructText *pSVar19;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  StructText *extraout_RAX;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  BrandInitializerText *__return_storage_ptr___00;
  BrandInitializerText *pBVar20;
  Impl *pIVar21;
  Schema SVar22;
  Impl *pIVar23;
  ArrayPtr<const_char> *params_1;
  char (*pacVar24) [6];
  char (*pacVar25) [6];
  uint64_t annotationId;
  ArrayPtr<const_char> *params;
  ArrayPtr<const_char> *params_00;
  CppTypeName *value;
  CppTypeName *value_00;
  long lVar26;
  size_t sVar27;
  size_t sVar28;
  unsigned_long i_00;
  CapnpcCppMain *this_00;
  long lVar29;
  StringTree *pSVar30;
  char (*params_2) [6];
  char *pcVar31;
  code *brandInitializers_00;
  ElementCount EVar32;
  TemplateContext *templateContext_00;
  size_t sVar33;
  bool bVar34;
  bool bVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  StringPtr scope_00;
  StringPtr name_00;
  StringPtr SVar40;
  StringPtr innerName;
  StringPtr type;
  StringPtr type_00;
  StringPtr fullName_00;
  StringPtr suffix;
  StringPtr suffix_00;
  char (*params_9) [348];
  ArrayPtr<const_char> *pAVar41;
  uint uVar42;
  size_t *firstElement;
  String *innerType;
  StringTree *local_7c0;
  undefined1 local_7b8 [8];
  undefined1 auStack_7b0 [24];
  Branch *local_798;
  Impl *pIStack_790;
  ArrayDisposer *local_788;
  String result_1;
  ArrayDisposer *pAStack_760;
  Branch *local_758;
  Impl *pIStack_750;
  ArrayDisposer *local_748;
  ArrayPtr<const_char> local_728;
  String fullName;
  StringTree declareText;
  BrandInitializerText brandInitializers;
  char *local_618;
  size_t sStack_610;
  ArrayDisposer *local_608;
  Branch *pBStack_600;
  size_t local_5f8;
  ArrayDisposer *local_5f0;
  CppTypeName whichName;
  Array<kj::StringTree> result_7;
  StringTree defineText;
  SegmentReader *local_558;
  CapTableReader *pCStack_550;
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText> fieldTexts;
  StructSchema schema_local;
  Array<kj::StringTree> result_6;
  Array<kj::StringTree> result_5;
  Array<kj::StringTree> result_4;
  ArrayPtr<const_char> local_4b8;
  ArrayDisposer *local_4a8;
  StringPtr scope_local;
  String subScope;
  undefined1 local_470 [24];
  StringTree local_458;
  Array<kj::StringTree> result_3;
  Array<kj::StringTree> result_2;
  String templates;
  char *local_3c0;
  StringTree local_3b8;
  StringTree local_378;
  char *local_340;
  size_t sStack_338;
  ArrayPtr<const_char> local_330;
  ArrayPtr<const_char> local_320;
  undefined1 local_310 [24];
  undefined8 local_2f8;
  undefined1 local_2f0 [16];
  ArrayPtr<const_char> local_2e0;
  ArrayPtr<const_char> local_2d0;
  undefined1 local_2c0 [24];
  undefined8 local_2a8;
  StringTree local_2a0;
  ListReader local_268;
  Reader proto;
  StringTree local_200;
  StringTree local_1c8;
  StringTree local_190;
  CappedArray<char,_17UL> hexId;
  ListReader local_138;
  undefined1 local_108 [40];
  BrandInitializerText local_e0;
  
  pIVar13 = pIStack_750;
  pBVar9 = local_758;
  pSVar30 = (StringTree *)name.content.ptr;
  scope_local.content.size_ = scope.content.size_;
  scope_local.content.ptr = scope.content.ptr;
  schema_local = schema;
  local_728 = name.content;
  Schema::getProto(&proto,&schema_local.super_Schema);
  proto_00._reader.pointerCount = proto._reader.pointerCount;
  proto_00._reader.dataSize = proto._reader.dataSize;
  proto_00._reader._38_2_ = proto._reader._38_2_;
  proto_00._reader._44_4_ = proto._reader._44_4_;
  proto_00._reader.nestingLimit = proto._reader.nestingLimit;
  proto_00._reader.capTable = proto._reader.capTable;
  proto_00._reader.segment = proto._reader.segment;
  proto_00._reader.data = proto._reader.data;
  proto_00._reader.pointers = proto._reader.pointers;
  annotationValue<capnp::schema::Node::Reader>
            ((Maybe<capnp::schema::Value::Reader> *)&brandInitializers,
             (CapnpcCppMain *)0xf264a779fef191ce,proto_00,annotationId);
  if ((char)brandInitializers.scopes.size_ != '\0') {
    bVar34 = brandInitializers.scopes.branches.size_._4_2_ == 0;
    pBVar16 = brandInitializers.scopes.branches.ptr;
    if (bVar34) {
      pBVar16 = (Branch *)0x0;
    }
    brandInitializers.scopes.text.content.disposer._0_4_ = 0x7fffffff;
    if (!bVar34) {
      brandInitializers.scopes.text.content.disposer._0_4_ =
           (int)brandInitializers.scopes.branches.disposer;
    }
    uVar36 = 0;
    uVar37 = 0;
    uVar38 = 0;
    uVar39 = 0;
    if (!bVar34) {
      uVar36 = brandInitializers.scopes.text.content.ptr._0_4_;
      uVar37 = brandInitializers.scopes.text.content.ptr._4_4_;
      uVar38 = (undefined4)brandInitializers.scopes.text.content.size_;
      uVar39 = brandInitializers.scopes.text.content.size_._4_4_;
    }
    brandInitializers.scopes.size_ = CONCAT44(uVar37,uVar36);
    brandInitializers.scopes.text.content.ptr = (char *)CONCAT44(uVar39,uVar38);
    brandInitializers.scopes.text.content.size_ = (size_t)pBVar16;
    local_728 = (ArrayPtr<const_char>)
                _::PointerReader::getBlob<capnp::Text>
                          ((PointerReader *)&brandInitializers,(void *)0x0,0);
  }
  __return_storage_ptr___00 = &brandInitializers;
  SVar40.content.size_ = 1;
  SVar40.content.ptr = "";
  TemplateContext::args
            (&__return_storage_ptr___00->scopes,(TemplateContext *)nestedTypeDecls.size_,SVar40);
  whichName.name.text.content.ptr = (char *)(scope_local.content.size_ - 1);
  whichName.name.size_ = (size_t)scope_local.content.ptr;
  auStack_7b0._0_8_ = local_728.size_ - 1;
  local_7b8 = (undefined1  [8])local_728.ptr;
  kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
            (&fullName,(_ *)&whichName,(ArrayPtr<const_char> *)local_7b8,
             (ArrayPtr<const_char> *)__return_storage_ptr___00,pSVar30);
  pBVar20 = (BrandInitializerText *)brandInitializers.scopes.branches.size_;
  pBVar16 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                         (int)brandInitializers.scopes.branches.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                        (int)brandInitializers.scopes.branches.disposer),pBVar16,0x40,pBVar20,
               pBVar20,kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    __return_storage_ptr___00 = pBVar20;
  }
  pBVar20 = (BrandInitializerText *)brandInitializers.scopes.text.content.size_;
  pcVar31 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                         (int)brandInitializers.scopes.text.content.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                        (int)brandInitializers.scopes.text.content.disposer),pcVar31,1,pBVar20,
               pBVar20,0);
    __return_storage_ptr___00 = pBVar20;
  }
  kj::str<kj::String&,char_const(&)[3]>
            (&subScope,(kj *)&fullName,(String *)0x220f64,(char (*) [3])__return_storage_ptr___00);
  StructSchema::getFields((FieldList *)&result_1,&schema_local);
  local_788 = local_748;
  local_798 = local_758;
  pIStack_790 = pIStack_750;
  auStack_7b0._8_8_ = result_1.content.disposer;
  auStack_7b0._16_8_ = pAStack_760;
  local_7b8 = (undefined1  [8])result_1.content.ptr;
  auStack_7b0._0_8_ = result_1.content.size_;
  psVar17 = (size_t *)
            kj::_::HeapArrayDisposer::allocateImpl
                      (0xe0,0,(ulong)local_758 & 0xffffffff,(_func_void_void_ptr *)0x0,
                       (_func_void_void_ptr *)0x0);
  declareText.text.content.size_ = (size_t)(psVar17 + ((ulong)local_758 & 0xffffffff) * 0x1c);
  declareText.text.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  firstElement = psVar17;
  declareText.size_ = (size_t)psVar17;
  if ((ListElementCount)local_798 != 0) {
    EVar32 = 0;
    do {
      auVar11 = local_7b8;
      _::ListReader::getStructElement
                ((StructReader *)&whichName.name.text.content.size_,(ListReader *)auStack_7b0,EVar32
                );
      whichName.name.size_ = (size_t)auVar11;
      whichName.name.text.content.ptr =
           (char *)CONCAT44(whichName.name.text.content.ptr._4_4_,EVar32);
      pcVar31 = "";
      if (subScope.content.size_ != 0) {
        pcVar31 = subScope.content.ptr;
      }
      scope_00.content.size_ = subScope.content.size_ + (subScope.content.size_ == 0);
      field.proto._reader.pointers._4_4_ = whichName.name.branches.size_._4_4_;
      field.proto._reader.pointers._0_4_ = (undefined4)whichName.name.branches.size_;
      field.proto._reader._36_4_ = whichName.name.branches.disposer._4_4_;
      field.proto._reader.dataSize = whichName.name.branches.disposer._0_4_;
      field.proto._reader._44_4_ = whichName._60_4_;
      field.proto._reader.nestingLimit._0_1_ = whichName.isArgDependent;
      field.proto._reader.nestingLimit._1_1_ = whichName.needsTypename;
      field.proto._reader.nestingLimit._2_1_ = whichName.hasInterfaces_;
      field.proto._reader.nestingLimit._3_1_ = whichName.hasDisambiguatedTemplate_;
      field._8_8_ = whichName.name.text.content.ptr;
      field.parent.super_Schema.raw = (Schema)(Schema)auVar11;
      field.proto._reader.segment = (SegmentReader *)whichName.name.text.content.size_;
      field.proto._reader.capTable = (CapTableReader *)whichName.name.text.content.disposer;
      field.proto._reader.data = whichName.name.branches.ptr;
      scope_00.content.ptr = pcVar31;
      makeFieldText((FieldText *)&brandInitializers,this,scope_00,field,
                    (TemplateContext *)nestedTypeDecls.size_);
      *psVar17 = brandInitializers.scopes.size_;
      psVar17[1] = (size_t)brandInitializers.scopes.text.content.ptr;
      psVar17[2] = brandInitializers.scopes.text.content.size_;
      brandInitializers.scopes.text.content.ptr = (char *)0x0;
      brandInitializers.scopes.text.content.size_ = 0;
      psVar17[3] = CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                            (int)brandInitializers.scopes.text.content.disposer);
      psVar17[4] = (size_t)brandInitializers.scopes.branches.ptr;
      psVar17[5] = brandInitializers.scopes.branches.size_;
      psVar17[6] = CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                            (int)brandInitializers.scopes.branches.disposer);
      brandInitializers.scopes.branches.ptr = (Branch *)0x0;
      brandInitializers.scopes.branches.size_ = 0;
      psVar17[7] = brandInitializers.bindings.size_;
      psVar17[8] = (size_t)brandInitializers.bindings.text.content.ptr;
      psVar17[9] = brandInitializers.bindings.text.content.size_;
      brandInitializers.bindings.text.content.ptr = (char *)0x0;
      brandInitializers.bindings.text.content.size_ = 0;
      psVar17[10] = (size_t)brandInitializers.bindings.text.content.disposer;
      psVar17[0xb] = (size_t)brandInitializers.bindings.branches.ptr;
      psVar17[0xc] = brandInitializers.bindings.branches.size_;
      psVar17[0xd] = (size_t)brandInitializers.bindings.branches.disposer;
      brandInitializers.bindings.branches.ptr = (Branch *)0x0;
      brandInitializers.bindings.branches.size_ = 0;
      psVar17[0xe] = brandInitializers.dependencies.size_;
      psVar17[0xf] = (size_t)brandInitializers.dependencies.text.content.ptr;
      psVar17[0x10] = brandInitializers.dependencies.text.content.size_;
      brandInitializers.dependencies.text.content.ptr = (char *)0x0;
      brandInitializers.dependencies.text.content.size_ = 0;
      psVar17[0x11] = (size_t)brandInitializers.dependencies.text.content.disposer;
      psVar17[0x12] = (size_t)brandInitializers.dependencies.branches.ptr;
      psVar17[0x13] = brandInitializers.dependencies.branches.size_;
      psVar17[0x14] = (size_t)brandInitializers.dependencies.branches.disposer;
      brandInitializers.dependencies.branches.ptr = (Branch *)0x0;
      brandInitializers.dependencies.branches.size_ = 0;
      psVar17[0x15] = brandInitializers.dependencyCount;
      psVar17[0x16] = (size_t)local_618;
      psVar17[0x17] = sStack_610;
      local_618 = (char *)0x0;
      sStack_610 = 0;
      psVar17[0x18] = (size_t)local_608;
      psVar17[0x19] = (size_t)pBStack_600;
      psVar17[0x1a] = local_5f8;
      psVar17[0x1b] = (size_t)local_5f0;
      pBStack_600 = (Branch *)0x0;
      local_5f8 = 0;
      psVar17 = psVar17 + 0x1c;
      FieldText::~FieldText((FieldText *)&brandInitializers);
      EVar32 = EVar32 + 1;
    } while (EVar32 != (ListElementCount)local_798);
  }
  lVar26 = (long)psVar17 - (long)firstElement >> 5;
  sVar27 = lVar26 * 0x6db6db6db6db6db7;
  innerType = (String *)CONCAT44((int)((ulong)firstElement >> 0x20),proto._reader.dataSize);
  if (proto._reader.dataSize < 0x120) {
    i = 0;
    if (0x3f < proto._reader.dataSize) goto LAB_00165506;
    i_00 = 0;
  }
  else {
    i = *(uint *)((long)proto._reader.data + 0x20);
LAB_00165506:
    i_00 = *proto._reader.data;
  }
  local_558 = proto._reader.segment;
  pCStack_550 = proto._reader.capTable;
  kj::hex(&hexId,i_00);
  TemplateContext::allDecls(&brandInitializers.scopes,(TemplateContext *)nestedTypeDecls.size_);
  kj::_::concat<kj::StringTree>(&templates,&brandInitializers.scopes);
  sVar33 = brandInitializers.scopes.branches.size_;
  pBVar16 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                         (int)brandInitializers.scopes.branches.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                        (int)brandInitializers.scopes.branches.disposer),pBVar16,0x40,sVar33,sVar33,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar33 = brandInitializers.scopes.text.content.size_;
  pcVar31 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                         (int)brandInitializers.scopes.text.content.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                        (int)brandInitializers.scopes.text.content.disposer),pcVar31,1,sVar33,sVar33
               ,0);
  }
  if ((uint)innerType < 0x80) {
    brandInitializers.scopes.size_ = (ulong)brandInitializers.scopes.size_._2_6_ << 0x10;
  }
  else {
    brandInitializers.scopes.size_ =
         CONCAT62(brandInitializers.scopes.size_._2_6_,
                  *(undefined2 *)((long)proto._reader.data + 0xe));
    if (0xcf < (uint)innerType) {
      uVar14 = *(undefined2 *)((long)proto._reader.data + 0x18);
      goto LAB_00165624;
    }
  }
  uVar14 = 0;
LAB_00165624:
  whichName.name.size_ = CONCAT62(whichName.name.size_._2_6_,uVar14);
  kj::
  strTree<char_const(&)[58],kj::CappedArray<char,17ul>&,char_const(&)[3],unsigned_short,char_const(&)[3],unsigned_short,char_const(&)[3]>
            (&declareText,(kj *)"  struct _capnpPrivate {\n    CAPNP_DECLARE_STRUCT_HEADER(",
             (char (*) [58])&hexId,(CappedArray<char,_17UL> *)0x22212e,
             (char (*) [3])&brandInitializers,(unsigned_short *)0x22212e,(char (*) [3])&whichName,
             (unsigned_short *)")\n",(char (*) [3])innerType);
  pcVar31 = "constexpr uint16_t ";
  pIVar21 = (Impl *)0x2214fe;
  kj::
  strTree<char_const(&)[4],kj::String&,char_const(&)[2],kj::String&,char_const(&)[20],kj::String&,char_const(&)[32],kj::String&,char_const(&)[20],kj::String&,char_const(&)[48],kj::String&,char_const(&)[25],kj::String&,char_const(&)[24],kj::String&,char_const(&)[40],kj::String&,char_const(&)[26]>
            (&defineText,(kj *)"// ",(char (*) [4])&fullName,(String *)0x2214fe,
             (char (*) [2])&templates,(String *)"constexpr uint16_t ",(char (*) [20])&fullName,
             (String *)"::_capnpPrivate::dataWordSize;\n",(char (*) [32])&templates,
             (String *)"constexpr uint16_t ",(char (*) [20])&fullName,
             (String *)"::_capnpPrivate::pointerCount;\n#if !CAPNP_LITE\n",(char (*) [48])&templates
             ,(String *)"constexpr ::capnp::Kind ",(char (*) [25])&fullName,
             (String *)"::_capnpPrivate::kind;\n",(char (*) [24])&templates,
             (String *)"constexpr ::capnp::_::RawSchema const* ",(char (*) [40])&fullName,
             (String *)"::_capnpPrivate::schema;\n",(char (*) [26])innerType);
  if ((*(uint *)(nestedTypeDecls.size_ + 0x38) < 0x121) ||
     ((*(byte *)(*(long *)(nestedTypeDecls.size_ + 0x28) + 0x24) & 1) == 0)) {
    whichName.name.size_ = (size_t)anon_var_dwarf_81861;
    whichName.name.text.content.ptr = (char *)0x92;
    kj::StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>>
              (&brandInitializers.scopes,&declareText,&whichName.name,
               (ArrayPtr<const_char> *)pIVar21);
    pIVar23 = (Impl *)declareText.text.content.size_;
    pcVar31 = declareText.text.content.ptr;
    declareText.size_ = brandInitializers.scopes.size_;
    if (declareText.text.content.ptr != (char *)0x0) {
      declareText.text.content.ptr = (char *)0x0;
      declareText.text.content.size_ = 0;
      (**(declareText.text.content.disposer)->_vptr_ArrayDisposer)
                (declareText.text.content.disposer,pcVar31,1,pIVar23,pIVar23,0);
      pIVar21 = pIVar23;
    }
    pIVar23 = (Impl *)declareText.branches.size_;
    pBVar16 = declareText.branches.ptr;
    declareText.text.content.ptr = brandInitializers.scopes.text.content.ptr;
    declareText.text.content.size_ = brandInitializers.scopes.text.content.size_;
    declareText.text.content.disposer =
         (ArrayDisposer *)
         CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                  (int)brandInitializers.scopes.text.content.disposer);
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    if (declareText.branches.ptr != (Branch *)0x0) {
      declareText.branches.ptr = (Branch *)0x0;
      declareText.branches.size_ = 0;
      (**(declareText.branches.disposer)->_vptr_ArrayDisposer)
                (declareText.branches.disposer,pBVar16,0x40,pIVar23,pIVar23,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      pIVar21 = pIVar23;
    }
    pIVar23 = (Impl *)brandInitializers.scopes.text.content.size_;
    pcVar31 = brandInitializers.scopes.text.content.ptr;
    declareText.branches.ptr = brandInitializers.scopes.branches.ptr;
    declareText.branches.disposer =
         (ArrayDisposer *)
         CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                  (int)brandInitializers.scopes.branches.disposer);
    declareText.branches.size_ = brandInitializers.scopes.branches.size_;
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
      brandInitializers.scopes.text.content.ptr = (char *)0x0;
      brandInitializers.scopes.text.content.size_ = 0;
      (*(code *)**(undefined8 **)
                  CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                           (int)brandInitializers.scopes.text.content.disposer))
                ((undefined8 *)
                 CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                          (int)brandInitializers.scopes.text.content.disposer),pcVar31,1,pIVar23,
                 pIVar23,0);
      pIVar21 = pIVar23;
    }
  }
  else {
    SVar22 = schema_local.super_Schema.raw;
    makeBrandInitializers
              (&brandInitializers,this,(TemplateContext *)nestedTypeDecls.size_,
               schema_local.super_Schema.raw);
    makeGenericDeclarations
              ((StringTree *)local_7b8,(CapnpcCppMain *)nestedTypeDecls.size_,
               (TemplateContext *)(ulong)(brandInitializers.dependencies.size_ != 0),
               SUB81(SVar22.raw,0));
    kj::strTree<kj::StringTree,char_const(&)[21],kj::StringTree,char_const(&)[28]>
              (&whichName.name,(kj *)&declareText,(StringTree *)"    #if !CAPNP_LITE\n",
               (char (*) [21])local_7b8,(StringTree *)0x22135d,(char (*) [28])pcVar31);
    sVar33 = declareText.text.content.size_;
    pcVar5 = declareText.text.content.ptr;
    declareText.size_ = whichName.name.size_;
    brandInitializers_00 = (code *)pcVar31;
    if (declareText.text.content.ptr != (char *)0x0) {
      declareText.text.content.ptr = (char *)0x0;
      declareText.text.content.size_ = 0;
      brandInitializers_00 = (code *)0x0;
      (**(declareText.text.content.disposer)->_vptr_ArrayDisposer)
                (declareText.text.content.disposer,pcVar5,1,sVar33,sVar33);
    }
    sVar33 = declareText.branches.size_;
    pBVar16 = declareText.branches.ptr;
    declareText.text.content.ptr = whichName.name.text.content.ptr;
    declareText.text.content.size_ = whichName.name.text.content.size_;
    declareText.text.content.disposer = whichName.name.text.content.disposer;
    whichName.name.text.content.ptr = (char *)0x0;
    whichName.name.text.content.size_ = 0;
    if (declareText.branches.ptr != (Branch *)0x0) {
      declareText.branches.ptr = (Branch *)0x0;
      declareText.branches.size_ = 0;
      brandInitializers_00 = kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct;
      (**(declareText.branches.disposer)->_vptr_ArrayDisposer)
                (declareText.branches.disposer,pBVar16,0x40,sVar33,sVar33);
    }
    sVar33 = whichName.name.text.content.size_;
    pcVar31 = whichName.name.text.content.ptr;
    declareText.branches.ptr = whichName.name.branches.ptr;
    declareText.branches.size_ =
         CONCAT44(whichName.name.branches.size_._4_4_,(undefined4)whichName.name.branches.size_);
    declareText.branches.disposer =
         (ArrayDisposer *)
         CONCAT44(whichName.name.branches.disposer._4_4_,whichName.name.branches.disposer._0_4_);
    whichName.name.branches.ptr = (Branch *)0x0;
    whichName.name.branches.size_._0_4_ = 0;
    whichName.name.branches.size_._4_4_ = 0;
    if (whichName.name.text.content.ptr != (char *)0x0) {
      whichName.name.text.content.ptr = (char *)0x0;
      whichName.name.text.content.size_ = 0;
      brandInitializers_00 = (code *)0x0;
      (**(whichName.name.text.content.disposer)->_vptr_ArrayDisposer)
                (whichName.name.text.content.disposer,pcVar31,1,sVar33,sVar33);
    }
    pIVar21 = pIStack_790;
    pBVar16 = local_798;
    if (local_798 != (Branch *)0x0) {
      local_798 = (Branch *)0x0;
      pIStack_790 = (Impl *)0x0;
      brandInitializers_00 = kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct;
      (**local_788->_vptr_ArrayDisposer)(local_788,pBVar16,0x40,pIVar21,pIVar21);
    }
    uVar12 = auStack_7b0._8_8_;
    uVar10 = auStack_7b0._0_8_;
    if ((SegmentReader *)auStack_7b0._0_8_ != (SegmentReader *)0x0) {
      auStack_7b0._0_8_ = (SegmentReader *)0x0;
      auStack_7b0._8_8_ = (StringTree *)0x0;
      brandInitializers_00 = (code *)0x0;
      (***(_func_int ***)auStack_7b0._16_8_)(auStack_7b0._16_8_,uVar10,1,uVar12,uVar12);
    }
    templateContext_00 = (TemplateContext *)fullName.content.ptr;
    if (fullName.content.size_ == 0) {
      templateContext_00 = (TemplateContext *)0x2214ff;
    }
    pIVar21 = (Impl *)(fullName.content.size_ + (fullName.content.size_ == 0));
    kj::heapString(&result_1,hexId.currentSize);
    if (hexId.currentSize != 0) {
      pcVar31 = (char *)result_1.content.size_;
      if (result_1.content.size_ != 0) {
        pcVar31 = result_1.content.ptr;
      }
      memcpy(pcVar31,hexId.content,hexId.currentSize);
    }
    local_340 = result_1.content.ptr;
    if (result_1.content.size_ == 0) {
      local_340 = "";
    }
    sStack_338 = result_1.content.size_ + (result_1.content.size_ == 0);
    local_e0.scopes.size_ = brandInitializers.scopes.size_;
    local_e0.scopes.text.content.ptr = brandInitializers.scopes.text.content.ptr;
    local_e0.scopes.text.content.size_ = brandInitializers.scopes.text.content.size_;
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    local_e0.scopes.text.content.disposer =
         (ArrayDisposer *)
         CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                  (int)brandInitializers.scopes.text.content.disposer);
    local_e0.scopes.branches.ptr = brandInitializers.scopes.branches.ptr;
    local_e0.scopes.branches.size_ = brandInitializers.scopes.branches.size_;
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    local_e0.bindings.size_ = brandInitializers.bindings.size_;
    local_e0.bindings.text.content.ptr = brandInitializers.bindings.text.content.ptr;
    local_e0.bindings.text.content.size_ = brandInitializers.bindings.text.content.size_;
    brandInitializers.bindings.text.content.ptr = (char *)0x0;
    brandInitializers.bindings.text.content.size_ = 0;
    local_e0.bindings.text.content.disposer = brandInitializers.bindings.text.content.disposer;
    local_e0.bindings.branches.ptr = brandInitializers.bindings.branches.ptr;
    local_e0.bindings.branches.size_ = brandInitializers.bindings.branches.size_;
    local_e0.bindings.branches.disposer = brandInitializers.bindings.branches.disposer;
    brandInitializers.bindings.branches.ptr = (Branch *)0x0;
    brandInitializers.bindings.branches.size_ = 0;
    local_e0.dependencies.size_ = brandInitializers.dependencies.size_;
    local_e0.dependencies.text.content.ptr = brandInitializers.dependencies.text.content.ptr;
    local_e0.dependencies.text.content.size_ = brandInitializers.dependencies.text.content.size_;
    brandInitializers.dependencies.text.content.ptr = (char *)0x0;
    brandInitializers.dependencies.text.content.size_ = 0;
    local_e0.dependencies.text.content.disposer =
         brandInitializers.dependencies.text.content.disposer;
    local_e0.dependencies.branches.ptr = brandInitializers.dependencies.branches.ptr;
    local_e0.dependencies.branches.size_ = brandInitializers.dependencies.branches.size_;
    local_e0.dependencies.branches.disposer = brandInitializers.dependencies.branches.disposer;
    brandInitializers.dependencies.branches.ptr = (Branch *)0x0;
    brandInitializers.dependencies.branches.size_ = 0;
    local_e0.dependencyCount = brandInitializers.dependencyCount;
    hexId_00.content.size_ = sStack_338;
    hexId_00.content.ptr = local_340;
    fullName_00.content.size_ = (size_t)&local_e0;
    fullName_00.content.ptr = (char *)pIVar21;
    makeGenericDefinitions
              ((StringTree *)local_7b8,(CapnpcCppMain *)nestedTypeDecls.size_,templateContext_00,
               fullName_00,hexId_00,(BrandInitializerText *)brandInitializers_00);
    kj::StringTree::concat<kj::StringTree,kj::StringTree>
              (&whichName.name,&defineText,(StringTree *)local_7b8,(StringTree *)pIVar21);
    pIVar23 = (Impl *)defineText.text.content.size_;
    pcVar31 = defineText.text.content.ptr;
    defineText.size_ = whichName.name.size_;
    if (defineText.text.content.ptr != (char *)0x0) {
      defineText.text.content.ptr = (char *)0x0;
      defineText.text.content.size_ = 0;
      (*(code *)**(undefined8 **)
                  CONCAT44(defineText.text.content.disposer._4_4_,
                           (int)defineText.text.content.disposer))
                ((undefined8 *)
                 CONCAT44(defineText.text.content.disposer._4_4_,
                          (int)defineText.text.content.disposer),pcVar31,1,pIVar23,pIVar23,0);
      pIVar21 = pIVar23;
    }
    pIVar23 = (Impl *)defineText.branches.size_;
    pBVar16 = defineText.branches.ptr;
    defineText.text.content.ptr = whichName.name.text.content.ptr;
    defineText.text.content.size_ = whichName.name.text.content.size_;
    defineText.text.content.disposer._0_4_ = whichName.name.text.content.disposer._0_4_;
    defineText.text.content.disposer._4_4_ = whichName.name.text.content.disposer._4_4_;
    whichName.name.text.content.ptr = (char *)0x0;
    whichName.name.text.content.size_ = 0;
    if (defineText.branches.ptr != (Branch *)0x0) {
      defineText.branches.ptr = (Branch *)0x0;
      defineText.branches.size_ = 0;
      (**(defineText.branches.disposer)->_vptr_ArrayDisposer)
                (defineText.branches.disposer,pBVar16,0x40,pIVar23,pIVar23,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      pIVar21 = pIVar23;
    }
    pIVar23 = (Impl *)whichName.name.text.content.size_;
    pcVar31 = whichName.name.text.content.ptr;
    defineText.branches.ptr = whichName.name.branches.ptr;
    defineText.branches.size_ =
         CONCAT44(whichName.name.branches.size_._4_4_,(undefined4)whichName.name.branches.size_);
    defineText.branches.disposer =
         (ArrayDisposer *)
         CONCAT44(whichName.name.branches.disposer._4_4_,whichName.name.branches.disposer._0_4_);
    whichName.name.branches.ptr = (Branch *)0x0;
    whichName.name.branches.size_._0_4_ = 0;
    whichName.name.branches.size_._4_4_ = 0;
    if (whichName.name.text.content.ptr != (char *)0x0) {
      whichName.name.text.content.ptr = (char *)0x0;
      whichName.name.text.content.size_ = 0;
      (**(whichName.name.text.content.disposer)->_vptr_ArrayDisposer)
                (whichName.name.text.content.disposer,pcVar31,1,pIVar23,pIVar23,0);
      pIVar21 = pIVar23;
    }
    pIVar23 = pIStack_790;
    pBVar16 = local_798;
    if (local_798 != (Branch *)0x0) {
      local_798 = (Branch *)0x0;
      pIStack_790 = (Impl *)0x0;
      (**local_788->_vptr_ArrayDisposer)
                (local_788,pBVar16,0x40,pIVar23,pIVar23,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      pIVar21 = pIVar23;
    }
    pIVar23 = (Impl *)auStack_7b0._8_8_;
    uVar10 = auStack_7b0._0_8_;
    if ((SegmentReader *)auStack_7b0._0_8_ != (SegmentReader *)0x0) {
      auStack_7b0._0_8_ = (SegmentReader *)0x0;
      auStack_7b0._8_8_ = (StringTree *)0x0;
      (***(_func_int ***)auStack_7b0._16_8_)(auStack_7b0._16_8_,uVar10,1,pIVar23,pIVar23,0);
      pIVar21 = pIVar23;
    }
    BrandInitializerText::~BrandInitializerText(&local_e0);
    pIVar23 = (Impl *)result_1.content.size_;
    pcVar31 = result_1.content.ptr;
    if (result_1.content.ptr != (char *)0x0) {
      result_1.content.ptr = (char *)0x0;
      result_1.content.size_ = 0;
      (**(result_1.content.disposer)->_vptr_ArrayDisposer)
                (result_1.content.disposer,pcVar31,1,pIVar23,pIVar23,0);
      pIVar21 = pIVar23;
    }
    BrandInitializerText::~BrandInitializerText(&brandInitializers);
  }
  whichName.name.size_ = (size_t)anon_var_dwarf_81879;
  whichName.name.text.content.ptr = (char *)0x4;
  kj::StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>>
            (&brandInitializers.scopes,&declareText,&whichName.name,(ArrayPtr<const_char> *)pIVar21)
  ;
  pAVar41 = (ArrayPtr<const_char> *)declareText.text.content.size_;
  pcVar31 = declareText.text.content.ptr;
  declareText.size_ = brandInitializers.scopes.size_;
  params_1 = (ArrayPtr<const_char> *)&declareText.text;
  if (declareText.text.content.ptr != (char *)0x0) {
    declareText.text.content.ptr = (char *)0x0;
    declareText.text.content.size_ = 0;
    (**(declareText.text.content.disposer)->_vptr_ArrayDisposer)
              (declareText.text.content.disposer,pcVar31,1,pAVar41,pAVar41,0);
    params_1 = pAVar41;
  }
  pAVar41 = (ArrayPtr<const_char> *)declareText.branches.size_;
  pBVar16 = declareText.branches.ptr;
  declareText.text.content.ptr = brandInitializers.scopes.text.content.ptr;
  declareText.text.content.size_ = brandInitializers.scopes.text.content.size_;
  declareText.text.content.disposer =
       (ArrayDisposer *)
       CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                (int)brandInitializers.scopes.text.content.disposer);
  brandInitializers.scopes.text.content.ptr = (char *)0x0;
  brandInitializers.scopes.text.content.size_ = 0;
  if (declareText.branches.ptr != (Branch *)0x0) {
    declareText.branches.ptr = (Branch *)0x0;
    declareText.branches.size_ = 0;
    (**(declareText.branches.disposer)->_vptr_ArrayDisposer)
              (declareText.branches.disposer,pBVar16,0x40,pAVar41,pAVar41,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    params_1 = pAVar41;
  }
  pAVar41 = (ArrayPtr<const_char> *)brandInitializers.scopes.text.content.size_;
  pcVar31 = brandInitializers.scopes.text.content.ptr;
  declareText.branches.ptr = brandInitializers.scopes.branches.ptr;
  declareText.branches.disposer =
       (ArrayDisposer *)
       CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                (int)brandInitializers.scopes.branches.disposer);
  declareText.branches.size_ = brandInitializers.scopes.branches.size_;
  brandInitializers.scopes.branches.ptr = (Branch *)0x0;
  brandInitializers.scopes.branches.size_ = 0;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                         (int)brandInitializers.scopes.text.content.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                        (int)brandInitializers.scopes.text.content.disposer),pcVar31,1,pAVar41,
               pAVar41,0);
    params_1 = pAVar41;
  }
  whichName.name.size_ = (long)"();\n#endif  // !CAPNP_LITE\n\n" + 4;
  whichName.name.text.content.ptr = (char *)0x18;
  kj::StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>>
            (&brandInitializers.scopes,&defineText,&whichName.name,params_1);
  sVar33 = defineText.text.content.size_;
  pcVar31 = defineText.text.content.ptr;
  defineText.size_ = brandInitializers.scopes.size_;
  if (defineText.text.content.ptr != (char *)0x0) {
    defineText.text.content.ptr = (char *)0x0;
    defineText.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(defineText.text.content.disposer._4_4_,
                         (int)defineText.text.content.disposer))
              ((undefined8 *)
               CONCAT44(defineText.text.content.disposer._4_4_,(int)defineText.text.content.disposer
                       ),pcVar31,1,sVar33,sVar33,0);
  }
  sVar33 = defineText.branches.size_;
  pBVar16 = defineText.branches.ptr;
  defineText.text.content.ptr = brandInitializers.scopes.text.content.ptr;
  defineText.text.content.size_ = brandInitializers.scopes.text.content.size_;
  defineText.text.content.disposer._0_4_ = (int)brandInitializers.scopes.text.content.disposer;
  defineText.text.content.disposer._4_4_ = brandInitializers.scopes.text.content.disposer._4_4_;
  brandInitializers.scopes.text.content.ptr = (char *)0x0;
  brandInitializers.scopes.text.content.size_ = 0;
  if (defineText.branches.ptr != (Branch *)0x0) {
    defineText.branches.ptr = (Branch *)0x0;
    defineText.branches.size_ = 0;
    (**(defineText.branches.disposer)->_vptr_ArrayDisposer)
              (defineText.branches.disposer,pBVar16,0x40,sVar33,sVar33,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar33 = brandInitializers.scopes.text.content.size_;
  pcVar31 = brandInitializers.scopes.text.content.ptr;
  defineText.branches.ptr = brandInitializers.scopes.branches.ptr;
  defineText.branches.disposer =
       (ArrayDisposer *)
       CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                (int)brandInitializers.scopes.branches.disposer);
  defineText.branches.size_ = brandInitializers.scopes.branches.size_;
  brandInitializers.scopes.branches.ptr = (Branch *)0x0;
  brandInitializers.scopes.branches.size_ = 0;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                         (int)brandInitializers.scopes.text.content.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                        (int)brandInitializers.scopes.text.content.disposer),pcVar31,1,sVar33,sVar33
               ,0);
  }
  whichName.name.branches.disposer._0_4_ = 0;
  whichName.name.branches.disposer._4_4_ = 0;
  whichName.isArgDependent = false;
  whichName.needsTypename = false;
  whichName.hasInterfaces_ = false;
  whichName.hasDisambiguatedTemplate_ = false;
  whichName.name.branches.ptr = (Branch *)0x0;
  whichName.name.branches.size_._0_4_ = 0;
  whichName.name.branches.size_._4_4_ = 0;
  whichName.name.text.content.size_ = 0;
  whichName.name.text.content.disposer = (ArrayDisposer *)0x0;
  whichName.name.size_ = 0;
  whichName.name.text.content.ptr = (char *)0x0;
  if ((0xff < (uint)innerType) && (*(short *)((long)proto._reader.data + 0x1e) != 0)) {
    brandInitializers.scopes.size_ = brandInitializers.scopes.size_ & 0xffffffffffffff00;
    cppFullName((CppTypeName *)local_7b8,this,schema_local.super_Schema.raw,
                schema_local.super_Schema.raw,
                (Maybe<capnp::InterfaceSchema::Method> *)&brandInitializers);
    CppTypeName::operator=(&whichName,(CppTypeName *)local_7b8);
    pIVar21 = pIStack_790;
    pBVar16 = local_798;
    if (local_798 != (Branch *)0x0) {
      local_798 = (Branch *)0x0;
      pIStack_790 = (Impl *)0x0;
      (**local_788->_vptr_ArrayDisposer)
                (local_788,pBVar16,0x40,pIVar21,pIVar21,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    uVar12 = auStack_7b0._8_8_;
    uVar10 = auStack_7b0._0_8_;
    if ((SegmentReader *)auStack_7b0._0_8_ != (SegmentReader *)0x0) {
      auStack_7b0._0_8_ = (SegmentReader *)0x0;
      auStack_7b0._8_8_ = (StringTree *)0x0;
      (***(_func_int ***)auStack_7b0._16_8_)(auStack_7b0._16_8_,uVar10,1,uVar12,uVar12,0);
    }
    innerName.content.size_ = 6;
    innerName.content.ptr = "Which";
    CppTypeName::addMemberType(&whichName,innerName);
  }
  bVar34 = TemplateContext::hasParams((TemplateContext *)nestedTypeDecls.size_);
  local_3c0 = "";
  if (bVar34) {
    local_3c0 = "  ";
  }
  suffix.content.size_ = 1;
  suffix.content.ptr = "";
  TemplateContext::decl(&local_190,(TemplateContext *)nestedTypeDecls.size_,true,suffix);
  kj::strTree<char_const*,kj::StringTree,char_const(&)[10],kj::StringPtr&,char_const(&)[3]>
            (&__return_storage_ptr__->outerTypeDecl,(kj *)&local_3c0,(char **)&local_190,
             (StringTree *)"  struct ",(char (*) [10])&local_728,(StringPtr *)0x222114,
             (char (*) [3])innerType);
  TemplateContext::parentDecls(&local_1c8,(TemplateContext *)nestedTypeDecls.size_);
  local_7c0 = (StringTree *)0x2214ff;
  suffix_00.content.size_ = 1;
  suffix_00.content.ptr = "";
  TemplateContext::decl
            (&local_200,(TemplateContext *)nestedTypeDecls.size_,scope_local.content.size_ < 2,
             suffix_00);
  if (((uint)innerType < 0x100) || (*(short *)((long)proto._reader.data + 0x1e) == 0)) {
    kj::StringTree::concat<>();
    bVar34 = false;
  }
  else {
    brandInitializers.scopes.text.content.size_ = (size_t)(proto._reader.pointers + 3);
    if (proto._reader.pointerCount < 4) {
      brandInitializers.scopes.text.content.size_ = (size_t)(WirePointer *)0x0;
    }
    if (proto._reader.pointerCount < 4) {
      local_558 = (SegmentReader *)0x0;
      pCStack_550 = (CapTableReader *)0x0;
      proto._reader.nestingLimit = 0x7fffffff;
    }
    brandInitializers.scopes.size_ = (size_t)local_558;
    brandInitializers.scopes.text.content.ptr = (char *)pCStack_550;
    brandInitializers.scopes.text.content.disposer._0_4_ = proto._reader.nestingLimit;
    _::PointerReader::getList
              (&local_138,(PointerReader *)&brandInitializers,INLINE_COMPOSITE,(word *)0x0);
    local_268.ptr = local_138.ptr;
    local_268.elementCount = local_138.elementCount;
    local_268.step = local_138.step;
    local_268.segment = local_138.segment;
    local_268.capTable = local_138.capTable;
    local_268.structDataSize = local_138.structDataSize;
    local_268.structPointerCount = local_138.structPointerCount;
    local_268.elementSize = local_138.elementSize;
    local_268._39_1_ = local_138._39_1_;
    local_268.nestingLimit = local_138.nestingLimit;
    local_268._44_4_ = local_138._44_4_;
    pacVar24 = (char (*) [6])0x0;
    params_2 = (char (*) [6])0x0;
    pSVar18 = (StringTree *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (0x38,0,local_138._24_8_ & 0xffffffff,(_func_void_void_ptr *)0x0,
                         (_func_void_void_ptr *)0x0);
    result_1.content.disposer = (ArrayDisposer *)(pSVar18 + (local_138._24_8_ & 0xffffffff));
    pAStack_760 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    pSVar30 = pSVar18;
    result_1.content.ptr = (char *)pSVar18;
    if (local_268.elementCount != 0) {
      EVar32 = 0;
      do {
        this_00 = (CapnpcCppMain *)local_7b8;
        result_1.content.size_ = (size_t)pSVar30;
        _::ListReader::getStructElement((StructReader *)local_7b8,&local_268,EVar32);
        if (((ListElementCount)local_798 < 0x20) ||
           (*(short *)((long)&((Maybe<kj::_::Mutex::Waiter_&> *)auStack_7b0._8_8_)->ptr + 2) == 0))
        {
          kj::StringTree::concat<>();
        }
        else {
          proto_01._reader.capTable = (CapTableReader *)auStack_7b0._0_8_;
          proto_01._reader.segment = (SegmentReader *)local_7b8;
          proto_01._reader.data = (void *)auStack_7b0._8_8_;
          proto_01._reader.pointers = (WirePointer *)auStack_7b0._16_8_;
          proto_01._reader._32_8_ = local_798;
          proto_01._reader._40_8_ = pIStack_790;
          SVar40 = protoName<capnp::schema::Field::Reader>(this_00,proto_01);
          name_00.content.ptr = (char *)SVar40.content.size_;
          name_00.content.size_ = (size_t)pacVar24;
          toUpperCase((String *)&local_378,(CapnpcCppMain *)SVar40.content.ptr,name_00);
          pacVar24 = (char (*) [6])0x2222a8;
          kj::strTree<char_const(&)[5],kj::String,char_const(&)[3]>
                    (&brandInitializers.scopes,(kj *)0x2329e8,(char (*) [5])&local_378,
                     (String *)0x2222a8,(char (*) [3])params_2);
          pacVar25 = (char (*) [6])local_378.text.content.ptr;
          sVar33 = local_378.size_;
          if (local_378.size_ != 0) {
            local_378.size_ = 0;
            local_378.text.content.ptr = (char *)0x0;
            params_2 = pacVar25;
            (*(code *)**(undefined8 **)local_378.text.content.size_)
                      (local_378.text.content.size_,sVar33,1,pacVar25,pacVar25,0);
            pacVar24 = pacVar25;
          }
        }
        pSVar30->size_ = brandInitializers.scopes.size_;
        (pSVar30->text).content.ptr = brandInitializers.scopes.text.content.ptr;
        (pSVar30->text).content.size_ = brandInitializers.scopes.text.content.size_;
        brandInitializers.scopes.text.content.ptr = (char *)0x0;
        brandInitializers.scopes.text.content.size_ = 0;
        (pSVar30->text).content.disposer =
             (ArrayDisposer *)
             CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                      (int)brandInitializers.scopes.text.content.disposer);
        (pSVar30->branches).ptr = brandInitializers.scopes.branches.ptr;
        (pSVar30->branches).size_ = brandInitializers.scopes.branches.size_;
        (pSVar30->branches).disposer =
             (ArrayDisposer *)
             CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                      (int)brandInitializers.scopes.branches.disposer);
        pSVar30 = pSVar30 + 1;
        EVar32 = EVar32 + 1;
      } while (EVar32 != local_268.elementCount);
    }
    result_2.size_ = ((long)pSVar30 - (long)pSVar18 >> 3) * 0x6db6db6db6db6db7;
    result_2.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    bVar34 = true;
    result_1.content.size_ = (size_t)pSVar30;
    result_2.ptr = pSVar18;
    kj::strTree<char_const(&)[26],kj::Array<kj::StringTree>,char_const(&)[6]>
              (&local_2a0,(kj *)"  enum Which: uint16_t {\n",(char (*) [26])&result_2,
               (Array<kj::StringTree> *)"  };\n",params_2);
  }
  result_3.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,(size_t)((nestedTypeDecls.ptr)->text).content.ptr,
                            (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar30 = result_3.ptr;
  if (((nestedTypeDecls.ptr)->text).content.ptr != (char *)0x0) {
    psVar17 = (size_t *)(nestedTypeDecls.ptr)->size_;
    do {
      pcVar31 = (char *)psVar17[1];
      sVar33 = psVar17[2];
      psVar17[1] = 0;
      psVar17[2] = 0;
      sVar28 = psVar17[5];
      pAVar3 = (ArrayDisposer *)psVar17[6];
      pAVar4 = (ArrayDisposer *)psVar17[3];
      pBVar16 = (Branch *)psVar17[4];
      psVar17[4] = 0;
      psVar17[5] = 0;
      pSVar30->size_ = *psVar17;
      (pSVar30->text).content.ptr = pcVar31;
      (pSVar30->text).content.size_ = sVar33;
      (pSVar30->text).content.disposer = pAVar4;
      (pSVar30->branches).ptr = pBVar16;
      (pSVar30->branches).size_ = sVar28;
      (pSVar30->branches).disposer = pAVar3;
      pSVar30 = pSVar30 + 1;
      psVar17 = psVar17 + 7;
    } while (psVar17 !=
             (size_t *)
             ((long)((nestedTypeDecls.ptr)->text).content.ptr * 0x38 + (nestedTypeDecls.ptr)->size_)
            );
  }
  result_3.size_ = ((long)pSVar30 - (long)result_3.ptr >> 3) * 0x6db6db6db6db6db7;
  result_3.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  kj::
  strTree<kj::StringTree,kj::StringTree,char_const(&)[8],kj::StringPtr&,kj::StringPtr&,char_const(&)[4],char_const(&)[3],kj::StringPtr&,char_const(&)[66],kj::StringTree,kj::Array<kj::StringTree>,char_const(&)[2],kj::StringTree,char_const(&)[2],char_const(&)[5]>
            (&__return_storage_ptr__->outerTypeDef,(kj *)&local_1c8,&local_200,
             (StringTree *)0x221386,(char (*) [8])&scope_local,(StringPtr *)&local_728,
             (StringPtr *)0x221eb0,(char (*) [4])0x220bfc,(char (*) [3])&local_728,
             (StringPtr *)"() = delete;\n\n  class Reader;\n  class Builder;\n  class Pipeline;\n",
             (char (*) [66])&local_2a0,(StringTree *)&result_3,(Array<kj::StringTree> *)0x2214fe,
             (char (*) [2])&declareText,(StringTree *)0x2214fe,(char (*) [2])0x2228ef,
             (char (*) [5])innerType);
  if (fullName.content.size_ != 0) {
    local_7c0 = (StringTree *)fullName.content.ptr;
  }
  sVar33 = fullName.content.size_ + (fullName.content.size_ == 0);
  bVar35 = true;
  if (0xff < (uint)innerType) {
    bVar35 = *(short *)((long)proto._reader.data + 0x1e) == 0;
  }
  pcVar31 = local_728.ptr;
  sVar28 = local_728.size_;
  result_4.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar27,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar30 = result_4.ptr;
  if (sVar27 != 0) {
    psVar17 = firstElement;
    do {
      pcVar5 = (char *)psVar17[1];
      sVar2 = psVar17[2];
      psVar17[1] = 0;
      psVar17[2] = 0;
      sVar6 = psVar17[5];
      pAVar3 = (ArrayDisposer *)psVar17[6];
      pAVar4 = (ArrayDisposer *)psVar17[3];
      pBVar16 = (Branch *)psVar17[4];
      psVar17[4] = 0;
      psVar17[5] = 0;
      pSVar30->size_ = *psVar17;
      (pSVar30->text).content.ptr = pcVar5;
      (pSVar30->text).content.size_ = sVar2;
      (pSVar30->text).content.disposer = pAVar4;
      (pSVar30->branches).ptr = pBVar16;
      (pSVar30->branches).size_ = sVar6;
      (pSVar30->branches).disposer = pAVar3;
      pSVar30 = pSVar30 + 1;
      psVar17 = psVar17 + 0x1c;
    } while (psVar17 != firstElement + lVar26 * 4);
  }
  result_4.size_ = ((long)pSVar30 - (long)result_4.ptr >> 3) * 0x6db6db6db6db6db7;
  result_4.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  result_7.ptr = local_7c0;
  local_470._0_8_ = pcVar31;
  local_470._8_8_ = sVar28;
  result_7.size_ = sVar33;
  TemplateContext::allDecls(&brandInitializers.scopes,(TemplateContext *)nestedTypeDecls.size_);
  local_3b8.size_ = 0;
  local_3b8.text.content.ptr = (char *)0x0;
  local_3b8.text.content.size_ = 0;
  type.content.size_ = (size_t)&local_3b8;
  type.content.ptr = (char *)sVar28;
  makeAsGenericDef((StringTree *)local_7b8,(CapnpcCppMain *)0x0,(AsGenericRole)nestedTypeDecls.size_
                   ,(TemplateContext *)pcVar31,type,innerType);
  if (bVar35) {
    params_9 = (char (*) [348])0x166703;
    kj::StringTree::concat<>();
  }
  else {
    local_458.size_ = 0x222779;
    local_458.text.content.ptr = (char *)0x1e;
    params_9 = (char (*) [348])0x166731;
    kj::StringTree::concat<kj::ArrayPtr<char_const>>((StringTree *)&result_1,&local_458,params);
  }
  kj::
  strTree<kj::StringTree,char_const(&)[7],kj::StringPtr&,char_const(&)[30],kj::StringPtr&,char_const(&)[365],kj::StringTree,kj::StringTree,kj::Array<kj::StringTree>,char_const(&)[348]>
            (&local_378,(kj *)&brandInitializers,(StringTree *)0x22118c,(char (*) [7])&result_7,
             (StringPtr *)"::Reader {\npublic:\n  typedef ",(char (*) [30])local_470,
             (StringPtr *)
             " Reads;\n\n  Reader() = default;\n  inline explicit Reader(::capnp::_::StructReader base): _reader(base) {}\n\n  inline ::capnp::MessageSize totalSize() const {\n    return _reader.totalSize().asPublic();\n  }\n\n#if !CAPNP_LITE\n  inline ::kj::StringTree toString() const {\n    return ::capnp::_::structString(_reader, *_capnpPrivate::brand());\n  }\n#endif  // !CAPNP_LITE\n\n"
             ,(char (*) [365])local_7b8,(StringTree *)&result_1,(StringTree *)&result_4,
             (Array<kj::StringTree> *)
             "private:\n  ::capnp::_::StructReader _reader;\n  template <typename, ::capnp::Kind>\n  friend struct ::capnp::ToDynamic_;\n  template <typename, ::capnp::Kind>\n  friend struct ::capnp::_::PointerHelpers;\n  template <typename, ::capnp::Kind>\n  friend struct ::capnp::List;\n  friend class ::capnp::MessageBuilder;\n  friend class ::capnp::Orphanage;\n};\n\n"
             ,params_9);
  if (local_758 != (Branch *)0x0) {
    local_758 = (Branch *)0x0;
    pIStack_750 = (Impl *)0x0;
    (**local_748->_vptr_ArrayDisposer)
              (local_748,pBVar9,0x40,pIVar13,pIVar13,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pIVar13 = pIStack_750;
  pBVar9 = local_758;
  pAVar3 = result_1.content.disposer;
  sVar33 = result_1.content.size_;
  if (result_1.content.size_ != 0) {
    result_1.content.size_ = 0;
    result_1.content.disposer = (ArrayDisposer *)0x0;
    (**pAStack_760->_vptr_ArrayDisposer)(pAStack_760,sVar33,1,pAVar3,pAVar3,0);
  }
  pIVar21 = pIStack_790;
  pBVar16 = local_798;
  if (local_798 != (Branch *)0x0) {
    local_798 = (Branch *)0x0;
    pIStack_790 = (Impl *)0x0;
    (**local_788->_vptr_ArrayDisposer)
              (local_788,pBVar16,0x40,pIVar21,pIVar21,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  uVar12 = auStack_7b0._8_8_;
  uVar10 = auStack_7b0._0_8_;
  if ((SegmentReader *)auStack_7b0._0_8_ != (SegmentReader *)0x0) {
    auStack_7b0._0_8_ = (SegmentReader *)0x0;
    auStack_7b0._8_8_ = (StringTree *)0x0;
    (***(_func_int ***)auStack_7b0._16_8_)(auStack_7b0._16_8_,uVar10,1,uVar12,uVar12,0);
  }
  pcVar31 = local_3b8.text.content.ptr;
  sVar33 = local_3b8.size_;
  if (local_3b8.size_ != 0) {
    local_3b8.size_ = 0;
    local_3b8.text.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_3b8.text.content.size_)
              (local_3b8.text.content.size_,sVar33,1,pcVar31,pcVar31,0);
  }
  sVar33 = brandInitializers.scopes.branches.size_;
  pBVar16 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                         (int)brandInitializers.scopes.branches.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                        (int)brandInitializers.scopes.branches.disposer),pBVar16,0x40,sVar33,sVar33,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar33 = brandInitializers.scopes.text.content.size_;
  pcVar31 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                         (int)brandInitializers.scopes.text.content.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                        (int)brandInitializers.scopes.text.content.disposer),pcVar31,1,sVar33,sVar33
               ,0);
  }
  pcVar31 = fullName.content.ptr;
  if (fullName.content.size_ == 0) {
    pcVar31 = "";
  }
  sVar33 = fullName.content.size_ + (fullName.content.size_ == 0);
  bVar35 = true;
  if (0xff < (uint)innerType) {
    bVar35 = *(short *)((long)proto._reader.data + 0x1e) == 0;
  }
  pcVar5 = local_728.ptr;
  sVar28 = local_728.size_;
  result_5.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar27,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar30 = result_5.ptr;
  if (sVar27 != 0) {
    lVar29 = 0;
    do {
      psVar17 = (size_t *)((long)firstElement + lVar29 + 0x38);
      sVar6 = *psVar17;
      pcVar7 = (char *)psVar17[1];
      sVar2 = *(size_t *)((long)firstElement + lVar29 + 0x48);
      puVar1 = (undefined8 *)((long)firstElement + lVar29 + 0x40);
      *puVar1 = 0;
      puVar1[1] = 0;
      psVar17 = (size_t *)((long)firstElement + lVar29 + 0x60);
      sVar8 = *psVar17;
      pAVar3 = (ArrayDisposer *)psVar17[1];
      puVar1 = (undefined8 *)((long)firstElement + lVar29 + 0x50);
      pAVar4 = (ArrayDisposer *)*puVar1;
      pBVar16 = (Branch *)puVar1[1];
      puVar1 = (undefined8 *)((long)firstElement + lVar29 + 0x58);
      *puVar1 = 0;
      puVar1[1] = 0;
      pSVar30->size_ = sVar6;
      (pSVar30->text).content.ptr = pcVar7;
      (pSVar30->text).content.size_ = sVar2;
      (pSVar30->text).content.disposer = pAVar4;
      (pSVar30->branches).ptr = pBVar16;
      (pSVar30->branches).size_ = sVar8;
      (pSVar30->branches).disposer = pAVar3;
      pSVar30 = pSVar30 + 1;
      lVar29 = lVar29 + 0xe0;
    } while (lVar26 * 0x20 - lVar29 != 0);
  }
  result_5.size_ = ((long)pSVar30 - (long)result_5.ptr >> 3) * 0x6db6db6db6db6db7;
  result_5.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_4b8.ptr = pcVar5;
  local_4b8.size_ = sVar28;
  local_470._0_8_ = pcVar31;
  local_470._8_8_ = sVar33;
  TemplateContext::allDecls(&brandInitializers.scopes,(TemplateContext *)nestedTypeDecls.size_);
  local_458.size_ = 0;
  local_458.text.content.ptr = (char *)0x0;
  local_458.text.content.size_ = 0;
  type_00.content.size_ = (size_t)&local_458;
  type_00.content.ptr = (char *)sVar28;
  makeAsGenericDef((StringTree *)local_7b8,(CapnpcCppMain *)0x1,(AsGenericRole)nestedTypeDecls.size_
                   ,(TemplateContext *)pcVar5,type_00,innerType);
  if (bVar35) {
    kj::StringTree::concat<>();
  }
  else {
    result_7.ptr = (StringTree *)anon_var_dwarf_823a4;
    result_7.size_ = 0x18;
    kj::StringTree::concat<kj::ArrayPtr<char_const>>
              ((StringTree *)&result_1,(StringTree *)&result_7,params_00);
  }
  kj::
  strTree<kj::StringTree,char_const(&)[7],kj::StringPtr&,char_const(&)[31],kj::StringPtr&,char_const(&)[593],kj::StringTree,kj::StringTree,kj::Array<kj::StringTree>,char_const(&)[157],char_const(&)[86]>
            (&local_3b8,(kj *)&brandInitializers,(StringTree *)0x22118c,(char (*) [7])local_470,
             (StringPtr *)"::Builder {\npublic:\n  typedef ",(char (*) [31])&local_4b8,
             (StringPtr *)
             " Builds;\n\n  Builder() = delete;  // Deleted to discourage incorrect usage.\n                       // You can explicitly initialize to nullptr instead.\n  inline Builder(decltype(nullptr)) {}\n  inline explicit Builder(::capnp::_::StructBuilder base): _builder(base) {}\n  inline operator Reader() const { return Reader(_builder.asReader()); }\n  inline Reader asReader() const { return *this; }\n\n  inline ::capnp::MessageSize totalSize() const { return asReader().totalSize(); }\n#if !CAPNP_LITE\n  inline ::kj::StringTree toString() const { return asReader().toString(); }\n#endif  // !CAPNP_LITE\n\n"
             ,(char (*) [593])local_7b8,(StringTree *)&result_1,(StringTree *)&result_5,
             (Array<kj::StringTree> *)
             "private:\n  ::capnp::_::StructBuilder _builder;\n  template <typename, ::capnp::Kind>\n  friend struct ::capnp::ToDynamic_;\n  friend class ::capnp::Orphanage;\n"
             ,(char (*) [157])
              "  template <typename, ::capnp::Kind>\n  friend struct ::capnp::_::PointerHelpers;\n};\n\n"
             ,(char (*) [86])innerType);
  if (local_758 != (Branch *)0x0) {
    local_758 = (Branch *)0x0;
    pIStack_750 = (Impl *)0x0;
    (**local_748->_vptr_ArrayDisposer)
              (local_748,pBVar9,0x40,pIVar13,pIVar13,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pAVar3 = result_1.content.disposer;
  sVar33 = result_1.content.size_;
  if (result_1.content.size_ != 0) {
    result_1.content.size_ = 0;
    result_1.content.disposer = (ArrayDisposer *)0x0;
    (**pAStack_760->_vptr_ArrayDisposer)(pAStack_760,sVar33,1,pAVar3,pAVar3,0);
  }
  pIVar13 = pIStack_790;
  pBVar9 = local_798;
  if (local_798 != (Branch *)0x0) {
    local_798 = (Branch *)0x0;
    pIStack_790 = (Impl *)0x0;
    (**local_788->_vptr_ArrayDisposer)
              (local_788,pBVar9,0x40,pIVar13,pIVar13,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  uVar12 = auStack_7b0._8_8_;
  uVar10 = auStack_7b0._0_8_;
  if ((SegmentReader *)auStack_7b0._0_8_ != (SegmentReader *)0x0) {
    auStack_7b0._0_8_ = (SegmentReader *)0x0;
    auStack_7b0._8_8_ = (StringTree *)0x0;
    (***(_func_int ***)auStack_7b0._16_8_)(auStack_7b0._16_8_,uVar10,1,uVar12,uVar12,0);
  }
  pcVar31 = local_458.text.content.ptr;
  sVar33 = local_458.size_;
  if (local_458.size_ != 0) {
    local_458.size_ = 0;
    local_458.text.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_458.text.content.size_)
              (local_458.text.content.size_,sVar33,1,pcVar31,pcVar31,0);
  }
  sVar33 = brandInitializers.scopes.branches.size_;
  pBVar9 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                         (int)brandInitializers.scopes.branches.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                        (int)brandInitializers.scopes.branches.disposer),pBVar9,0x40,sVar33,sVar33,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar33 = brandInitializers.scopes.text.content.size_;
  pcVar31 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                         (int)brandInitializers.scopes.text.content.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                        (int)brandInitializers.scopes.text.content.disposer),pcVar31,1,sVar33,sVar33
               ,0);
  }
  pcVar31 = fullName.content.ptr;
  if (fullName.content.size_ == 0) {
    pcVar31 = "";
  }
  sVar28 = fullName.content.size_ + (fullName.content.size_ == 0);
  pcVar5 = local_728.ptr;
  sVar33 = local_728.size_;
  result_6.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar27,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar30 = result_6.ptr;
  if (sVar27 != 0) {
    lVar29 = 0;
    do {
      psVar17 = (size_t *)((long)firstElement + lVar29 + 0x70);
      sVar6 = *psVar17;
      pcVar7 = (char *)psVar17[1];
      sVar2 = *(size_t *)((long)firstElement + lVar29 + 0x80);
      puVar1 = (undefined8 *)((long)firstElement + lVar29 + 0x78);
      *puVar1 = 0;
      puVar1[1] = 0;
      psVar17 = (size_t *)((long)firstElement + lVar29 + 0x98);
      sVar8 = *psVar17;
      pAVar3 = (ArrayDisposer *)psVar17[1];
      puVar1 = (undefined8 *)((long)firstElement + lVar29 + 0x88);
      pAVar4 = (ArrayDisposer *)*puVar1;
      pBVar9 = (Branch *)puVar1[1];
      puVar1 = (undefined8 *)((long)firstElement + lVar29 + 0x90);
      *puVar1 = 0;
      puVar1[1] = 0;
      pSVar30->size_ = sVar6;
      (pSVar30->text).content.ptr = pcVar7;
      (pSVar30->text).content.size_ = sVar2;
      (pSVar30->text).content.disposer = pAVar4;
      (pSVar30->branches).ptr = pBVar9;
      (pSVar30->branches).size_ = sVar8;
      (pSVar30->branches).disposer = pAVar3;
      pSVar30 = pSVar30 + 1;
      lVar29 = lVar29 + 0xe0;
    } while (lVar26 * 0x20 - lVar29 != 0);
  }
  result_6.size_ = ((long)pSVar30 - (long)result_6.ptr >> 3) * 0x6db6db6db6db6db7;
  result_6.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_458.size_ = (size_t)pcVar5;
  local_458.text.content.ptr = (char *)sVar33;
  result_1.content.ptr = pcVar31;
  result_1.content.size_ = sVar28;
  TemplateContext::allDecls(&brandInitializers.scopes,(TemplateContext *)nestedTypeDecls.size_);
  pSVar30 = (StringTree *)&result_1;
  kj::
  strTree<char_const(&)[17],kj::StringTree,char_const(&)[7],kj::StringPtr&,char_const(&)[32],kj::StringPtr&,char_const(&)[183],kj::Array<kj::StringTree>,char_const(&)[192]>
            ((StringTree *)local_7b8,(kj *)0x220c7c,(char (*) [17])&brandInitializers,
             (StringTree *)0x22118c,(char (*) [7])pSVar30,
             (StringPtr *)"::Pipeline {\npublic:\n  typedef ",(char (*) [32])&local_458,
             (StringPtr *)
             " Pipelines;\n\n  inline Pipeline(decltype(nullptr)): _typeless(nullptr) {}\n  inline explicit Pipeline(::capnp::AnyPointer::Pipeline&& typeless)\n      : _typeless(kj::mv(typeless)) {}\n\n"
             ,(char (*) [183])&result_6,
             (Array<kj::StringTree> *)
             "private:\n  ::capnp::AnyPointer::Pipeline _typeless;\n  friend class ::capnp::PipelineHook;\n  template <typename, ::capnp::Kind>\n  friend struct ::capnp::ToDynamic_;\n};\n#endif  // !CAPNP_LITE\n\n"
             ,(char (*) [192])innerType);
  pSVar18 = (StringTree *)brandInitializers.scopes.branches.size_;
  pBVar9 = brandInitializers.scopes.branches.ptr;
  uVar42 = (uint)innerType;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                         (int)brandInitializers.scopes.branches.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                        (int)brandInitializers.scopes.branches.disposer),pBVar9,0x40,pSVar18,pSVar18
               ,kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pSVar30 = pSVar18;
  }
  pSVar18 = (StringTree *)brandInitializers.scopes.text.content.size_;
  pcVar31 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                         (int)brandInitializers.scopes.text.content.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                        (int)brandInitializers.scopes.text.content.disposer),pcVar31,1,pSVar18,
               pSVar18,0);
    pSVar30 = pSVar18;
  }
  kj::StringTree::concat<kj::StringTree,kj::StringTree,kj::StringTree>
            (&__return_storage_ptr__->readerBuilderDefs,&local_378,&local_3b8,
             (StringTree *)local_7b8,pSVar30);
  if ((uVar42 < 0x100) || (*(short *)((long)proto._reader.data + 0x1e) == 0)) {
    kj::StringTree::concat<>();
    bVar35 = false;
  }
  else {
    TemplateContext::allDecls((StringTree *)&result_1,(TemplateContext *)nestedTypeDecls.size_);
    TemplateContext::allDecls(&local_458,(TemplateContext *)nestedTypeDecls.size_);
    local_2c0._16_8_ = "inline ";
    local_2a8 = 7;
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&result_7,(kj *)&whichName,value);
    local_2c0._0_8_ = " ";
    local_2c0._8_8_ = 1;
    local_2d0.size_ = 0;
    if (fullName.content.size_ != 0) {
      local_2d0.size_ = fullName.content.size_ - 1;
    }
    local_2e0.ptr =
         "::Reader::which() const {\n  return _reader.getDataField<Which>(\n      ::capnp::bounded<"
    ;
    local_2e0.size_ = 0x57;
    kj::_::Stringifier::operator*((CappedArray<char,_14UL> *)local_470,(Stringifier *)&kj::_::STR,i)
    ;
    local_2f0._0_8_ = ">() * ::capnp::ELEMENTS);\n}\n";
    local_2f0[8] = '\x1c';
    local_2f0[9] = '\0';
    local_2f0[10] = '\0';
    local_2f0[0xb] = '\0';
    local_2f0[0xc] = '\0';
    local_2f0[0xd] = '\0';
    local_2f0[0xe] = '\0';
    local_2f0[0xf] = '\0';
    local_310._16_8_ = "inline ";
    local_2f8 = 7;
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&local_4b8,(kj *)&whichName,value_00);
    local_310._0_8_ = " ";
    local_310._8_8_ = 1;
    local_320.size_ = 0;
    if (fullName.content.size_ != 0) {
      local_320.size_ = fullName.content.size_ - 1;
    }
    local_330.ptr =
         "::Builder::which() {\n  return _builder.getDataField<Which>(\n      ::capnp::bounded<";
    local_330.size_ = 0x53;
    pAVar41 = (ArrayPtr<const_char> *)0x167062;
    kj::_::Stringifier::operator*
              ((CappedArray<char,_14UL> *)(local_108 + 0x10),(Stringifier *)&kj::_::STR,i);
    local_108._0_8_ = ">() * ::capnp::ELEMENTS);\n}\n\n";
    local_108[8] = '\x1d';
    local_108[9] = '\0';
    local_108[10] = '\0';
    local_108[0xb] = '\0';
    local_108[0xc] = '\0';
    local_108[0xd] = '\0';
    local_108[0xe] = '\0';
    local_108[0xf] = '\0';
    kj::StringTree::
    concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
              (&brandInitializers.scopes,(StringTree *)&result_1,(StringTree *)(local_2c0 + 0x10),
               (ArrayPtr<const_char> *)&result_7,(String *)local_2c0,&local_2d0,&local_2e0,
               (ArrayPtr<const_char> *)local_470,(CappedArray<char,_14UL> *)local_2f0,
               (ArrayPtr<const_char> *)&local_458,(StringTree *)(local_310 + 0x10),&local_4b8,
               (String *)local_310,&local_320,&local_330,(ArrayPtr<const_char> *)(local_108 + 0x10),
               (CappedArray<char,_14UL> *)local_108,pAVar41);
    sVar33 = local_4b8.size_;
    pcVar31 = local_4b8.ptr;
    if ((TemplateContext *)local_4b8.ptr != (TemplateContext *)0x0) {
      local_4b8.ptr = (char *)0x0;
      local_4b8.size_ = 0;
      (**local_4a8->_vptr_ArrayDisposer)(local_4a8,pcVar31,1,sVar33,sVar33,0);
    }
    sVar33 = result_7.size_;
    pSVar30 = result_7.ptr;
    if (result_7.ptr != (StringTree *)0x0) {
      result_7.ptr = (StringTree *)0x0;
      result_7.size_ = 0;
      (**(result_7.disposer)->_vptr_ArrayDisposer)(result_7.disposer,pSVar30,1,sVar33,sVar33,0);
    }
    bVar35 = true;
  }
  result_7.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar27,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar30 = result_7.ptr;
  if (sVar27 != 0) {
    lVar29 = 0;
    do {
      psVar17 = (size_t *)((long)firstElement + lVar29 + 0xa8);
      sVar28 = *psVar17;
      pcVar31 = (char *)psVar17[1];
      sVar33 = *(size_t *)((long)firstElement + lVar29 + 0xb8);
      puVar1 = (undefined8 *)((long)firstElement + lVar29 + 0xb0);
      *puVar1 = 0;
      puVar1[1] = 0;
      psVar17 = (size_t *)((long)firstElement + lVar29 + 0xd0);
      sVar2 = *psVar17;
      pAVar3 = (ArrayDisposer *)psVar17[1];
      puVar1 = (undefined8 *)((long)firstElement + lVar29 + 0xc0);
      pAVar4 = (ArrayDisposer *)*puVar1;
      pBVar9 = (Branch *)puVar1[1];
      puVar1 = (undefined8 *)((long)firstElement + lVar29 + 200);
      *puVar1 = 0;
      puVar1[1] = 0;
      pSVar30->size_ = sVar28;
      (pSVar30->text).content.ptr = pcVar31;
      (pSVar30->text).content.size_ = sVar33;
      (pSVar30->text).content.disposer = pAVar4;
      (pSVar30->branches).ptr = pBVar9;
      (pSVar30->branches).size_ = sVar2;
      (pSVar30->branches).disposer = pAVar3;
      pSVar30 = pSVar30 + 1;
      lVar29 = lVar29 + 0xe0;
    } while (lVar26 * 0x20 - lVar29 != 0);
  }
  result_7.size_ = ((long)pSVar30 - (long)result_7.ptr >> 3) * 0x6db6db6db6db6db7;
  result_7.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  kj::strTree<kj::StringTree,kj::Array<kj::StringTree>>
            (&__return_storage_ptr__->inlineMethodDefs,(kj *)&brandInitializers,
             (StringTree *)&result_7,(Array<kj::StringTree> *)result_7.size_);
  sVar33 = result_7.size_;
  pSVar30 = result_7.ptr;
  (__return_storage_ptr__->sourceDefs).size_ = defineText.size_;
  (__return_storage_ptr__->sourceDefs).text.content.ptr = defineText.text.content.ptr;
  (__return_storage_ptr__->sourceDefs).text.content.size_ = defineText.text.content.size_;
  defineText.text.content.ptr = (char *)0x0;
  defineText.text.content.size_ = 0;
  *(int *)&(__return_storage_ptr__->sourceDefs).text.content.disposer =
       (int)defineText.text.content.disposer;
  *(undefined4 *)((long)&(__return_storage_ptr__->sourceDefs).text.content.disposer + 4) =
       defineText.text.content.disposer._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->sourceDefs).branches.ptr = defineText.branches.ptr._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->sourceDefs).branches.ptr + 4) =
       defineText.branches.ptr._4_4_;
  (__return_storage_ptr__->sourceDefs).branches.size_ = defineText.branches.size_;
  (__return_storage_ptr__->sourceDefs).branches.disposer = defineText.branches.disposer;
  defineText.branches.ptr = (Branch *)0x0;
  defineText.branches.size_ = 0;
  pSVar19 = (StructText *)defineText.branches.disposer;
  if (result_7.ptr != (StringTree *)0x0) {
    result_7.ptr = (StringTree *)0x0;
    result_7.size_ = 0;
    iVar15 = (**(result_7.disposer)->_vptr_ArrayDisposer)
                       (result_7.disposer,pSVar30,0x38,sVar33,sVar33,
                        kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    pSVar19 = (StructText *)CONCAT44(extraout_var,iVar15);
  }
  sVar33 = brandInitializers.scopes.branches.size_;
  pBVar9 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    pSVar19 = (StructText *)
              (*(code *)**(undefined8 **)
                          CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                                   (int)brandInitializers.scopes.branches.disposer))
                        ((undefined8 *)
                         CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                                  (int)brandInitializers.scopes.branches.disposer),pBVar9,0x40,
                         sVar33,sVar33,
                         kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar33 = brandInitializers.scopes.text.content.size_;
  pcVar31 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    pSVar19 = (StructText *)
              (*(code *)**(undefined8 **)
                          CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                                   (int)brandInitializers.scopes.text.content.disposer))
                        ((undefined8 *)
                         CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                                  (int)brandInitializers.scopes.text.content.disposer),pcVar31,1,
                         sVar33,sVar33,0);
  }
  sVar33 = local_458.branches.size_;
  pBVar9 = local_458.branches.ptr;
  if (bVar35) {
    if (local_458.branches.ptr != (Branch *)0x0) {
      local_458.branches.ptr = (Branch *)0x0;
      local_458.branches.size_ = 0;
      iVar15 = (**(local_458.branches.disposer)->_vptr_ArrayDisposer)
                         (local_458.branches.disposer,pBVar9,0x40,sVar33,sVar33,
                          kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      pSVar19 = (StructText *)CONCAT44(extraout_var_00,iVar15);
    }
    sVar33 = local_458.text.content.size_;
    pcVar31 = local_458.text.content.ptr;
    if (local_458.text.content.ptr != (char *)0x0) {
      local_458.text.content.ptr = (char *)0x0;
      local_458.text.content.size_ = 0;
      iVar15 = (**(local_458.text.content.disposer)->_vptr_ArrayDisposer)
                         (local_458.text.content.disposer,pcVar31,1,sVar33,sVar33,0);
      pSVar19 = (StructText *)CONCAT44(extraout_var_01,iVar15);
    }
    if (local_758 != (Branch *)0x0) {
      iVar15 = (**local_748->_vptr_ArrayDisposer)
                         (local_748,local_758,0x40,pIStack_750,pIStack_750,
                          kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      pSVar19 = (StructText *)CONCAT44(extraout_var_02,iVar15);
    }
    pAVar3 = result_1.content.disposer;
    sVar33 = result_1.content.size_;
    if (result_1.content.size_ != 0) {
      result_1.content.size_ = 0;
      result_1.content.disposer = (ArrayDisposer *)0x0;
      iVar15 = (**pAStack_760->_vptr_ArrayDisposer)(pAStack_760,sVar33,1,pAVar3,pAVar3,0);
      pSVar19 = (StructText *)CONCAT44(extraout_var_03,iVar15);
    }
  }
  pIVar13 = pIStack_790;
  pBVar9 = local_798;
  if (local_798 != (Branch *)0x0) {
    local_798 = (Branch *)0x0;
    pIStack_790 = (Impl *)0x0;
    iVar15 = (**local_788->_vptr_ArrayDisposer)
                       (local_788,pBVar9,0x40,pIVar13,pIVar13,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pSVar19 = (StructText *)CONCAT44(extraout_var_04,iVar15);
  }
  uVar12 = auStack_7b0._8_8_;
  uVar10 = auStack_7b0._0_8_;
  if ((SegmentReader *)auStack_7b0._0_8_ != (SegmentReader *)0x0) {
    auStack_7b0._0_8_ = (SegmentReader *)0x0;
    auStack_7b0._8_8_ = (StringTree *)0x0;
    iVar15 = (***(_func_int ***)auStack_7b0._16_8_)(auStack_7b0._16_8_,uVar10,1,uVar12,uVar12,0);
    pSVar19 = (StructText *)CONCAT44(extraout_var_05,iVar15);
  }
  sVar33 = result_6.size_;
  pSVar30 = result_6.ptr;
  if (result_6.ptr != (StringTree *)0x0) {
    result_6.ptr = (StringTree *)0x0;
    result_6.size_ = 0;
    iVar15 = (**(result_6.disposer)->_vptr_ArrayDisposer)
                       (result_6.disposer,pSVar30,0x38,sVar33,sVar33,
                        kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    pSVar19 = (StructText *)CONCAT44(extraout_var_06,iVar15);
  }
  sVar33 = local_3b8.branches.size_;
  pBVar9 = local_3b8.branches.ptr;
  if (local_3b8.branches.ptr != (Branch *)0x0) {
    local_3b8.branches.ptr = (Branch *)0x0;
    local_3b8.branches.size_ = 0;
    iVar15 = (**(local_3b8.branches.disposer)->_vptr_ArrayDisposer)
                       (local_3b8.branches.disposer,pBVar9,0x40,sVar33,sVar33,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pSVar19 = (StructText *)CONCAT44(extraout_var_07,iVar15);
  }
  sVar33 = local_3b8.text.content.size_;
  pcVar31 = local_3b8.text.content.ptr;
  if (local_3b8.text.content.ptr != (char *)0x0) {
    local_3b8.text.content.ptr = (char *)0x0;
    local_3b8.text.content.size_ = 0;
    iVar15 = (**(local_3b8.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_3b8.text.content.disposer,pcVar31,1,sVar33,sVar33,0);
    pSVar19 = (StructText *)CONCAT44(extraout_var_08,iVar15);
  }
  sVar33 = result_5.size_;
  pSVar30 = result_5.ptr;
  if (result_5.ptr != (StringTree *)0x0) {
    result_5.ptr = (StringTree *)0x0;
    result_5.size_ = 0;
    iVar15 = (**(result_5.disposer)->_vptr_ArrayDisposer)
                       (result_5.disposer,pSVar30,0x38,sVar33,sVar33,
                        kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    pSVar19 = (StructText *)CONCAT44(extraout_var_09,iVar15);
  }
  sVar33 = local_378.branches.size_;
  pBVar9 = local_378.branches.ptr;
  if (local_378.branches.ptr != (Branch *)0x0) {
    local_378.branches.ptr = (Branch *)0x0;
    local_378.branches.size_ = 0;
    iVar15 = (**(local_378.branches.disposer)->_vptr_ArrayDisposer)
                       (local_378.branches.disposer,pBVar9,0x40,sVar33,sVar33,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pSVar19 = (StructText *)CONCAT44(extraout_var_10,iVar15);
  }
  sVar33 = local_378.text.content.size_;
  pcVar31 = local_378.text.content.ptr;
  if ((char (*) [6])local_378.text.content.ptr != (char (*) [6])0x0) {
    local_378.text.content.ptr = (char *)0x0;
    local_378.text.content.size_ = 0;
    iVar15 = (**(local_378.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_378.text.content.disposer,pcVar31,1,sVar33,sVar33,0);
    pSVar19 = (StructText *)CONCAT44(extraout_var_11,iVar15);
  }
  sVar33 = result_4.size_;
  pSVar30 = result_4.ptr;
  if (result_4.ptr != (StringTree *)0x0) {
    result_4.ptr = (StringTree *)0x0;
    result_4.size_ = 0;
    iVar15 = (**(result_4.disposer)->_vptr_ArrayDisposer)
                       (result_4.disposer,pSVar30,0x38,sVar33,sVar33,
                        kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    pSVar19 = (StructText *)CONCAT44(extraout_var_12,iVar15);
  }
  sVar33 = result_3.size_;
  pSVar30 = result_3.ptr;
  if (result_3.ptr != (StringTree *)0x0) {
    result_3.ptr = (StringTree *)0x0;
    result_3.size_ = 0;
    iVar15 = (**(result_3.disposer)->_vptr_ArrayDisposer)
                       (result_3.disposer,pSVar30,0x38,sVar33,sVar33,
                        kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    pSVar19 = (StructText *)CONCAT44(extraout_var_13,iVar15);
  }
  sVar33 = local_2a0.branches.size_;
  pBVar9 = local_2a0.branches.ptr;
  if (local_2a0.branches.ptr != (Branch *)0x0) {
    local_2a0.branches.ptr = (Branch *)0x0;
    local_2a0.branches.size_ = 0;
    iVar15 = (**(local_2a0.branches.disposer)->_vptr_ArrayDisposer)
                       (local_2a0.branches.disposer,pBVar9,0x40,sVar33,sVar33,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pSVar19 = (StructText *)CONCAT44(extraout_var_14,iVar15);
  }
  sVar33 = local_2a0.text.content.size_;
  pcVar31 = local_2a0.text.content.ptr;
  if (local_2a0.text.content.ptr != (char *)0x0) {
    local_2a0.text.content.ptr = (char *)0x0;
    local_2a0.text.content.size_ = 0;
    iVar15 = (**(local_2a0.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_2a0.text.content.disposer,pcVar31,1,sVar33,sVar33,0);
    pSVar19 = (StructText *)CONCAT44(extraout_var_15,iVar15);
  }
  sVar33 = result_2.size_;
  pSVar30 = result_2.ptr;
  if ((bVar34) && (result_2.ptr != (StringTree *)0x0)) {
    result_2.ptr = (StringTree *)0x0;
    result_2.size_ = 0;
    iVar15 = (**(result_2.disposer)->_vptr_ArrayDisposer)
                       (result_2.disposer,pSVar30,0x38,sVar33,sVar33,
                        kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    pSVar19 = (StructText *)CONCAT44(extraout_var_16,iVar15);
  }
  sVar33 = local_200.branches.size_;
  pBVar9 = local_200.branches.ptr;
  if (local_200.branches.ptr != (Branch *)0x0) {
    local_200.branches.ptr = (Branch *)0x0;
    local_200.branches.size_ = 0;
    iVar15 = (**(local_200.branches.disposer)->_vptr_ArrayDisposer)
                       (local_200.branches.disposer,pBVar9,0x40,sVar33,sVar33,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pSVar19 = (StructText *)CONCAT44(extraout_var_17,iVar15);
  }
  sVar33 = local_200.text.content.size_;
  pcVar31 = local_200.text.content.ptr;
  if (local_200.text.content.ptr != (char *)0x0) {
    local_200.text.content.ptr = (char *)0x0;
    local_200.text.content.size_ = 0;
    iVar15 = (**(local_200.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_200.text.content.disposer,pcVar31,1,sVar33,sVar33,0);
    pSVar19 = (StructText *)CONCAT44(extraout_var_18,iVar15);
  }
  sVar33 = local_1c8.branches.size_;
  pBVar9 = local_1c8.branches.ptr;
  if (local_1c8.branches.ptr != (Branch *)0x0) {
    local_1c8.branches.ptr = (Branch *)0x0;
    local_1c8.branches.size_ = 0;
    iVar15 = (**(local_1c8.branches.disposer)->_vptr_ArrayDisposer)
                       (local_1c8.branches.disposer,pBVar9,0x40,sVar33,sVar33,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pSVar19 = (StructText *)CONCAT44(extraout_var_19,iVar15);
  }
  sVar33 = local_1c8.text.content.size_;
  pcVar31 = local_1c8.text.content.ptr;
  if (local_1c8.text.content.ptr != (char *)0x0) {
    local_1c8.text.content.ptr = (char *)0x0;
    local_1c8.text.content.size_ = 0;
    iVar15 = (**(local_1c8.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_1c8.text.content.disposer,pcVar31,1,sVar33,sVar33,0);
    pSVar19 = (StructText *)CONCAT44(extraout_var_20,iVar15);
  }
  sVar33 = local_190.branches.size_;
  pBVar9 = local_190.branches.ptr;
  if (local_190.branches.ptr != (Branch *)0x0) {
    local_190.branches.ptr = (Branch *)0x0;
    local_190.branches.size_ = 0;
    iVar15 = (**(local_190.branches.disposer)->_vptr_ArrayDisposer)
                       (local_190.branches.disposer,pBVar9,0x40,sVar33,sVar33,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pSVar19 = (StructText *)CONCAT44(extraout_var_21,iVar15);
  }
  sVar33 = local_190.text.content.size_;
  pcVar31 = local_190.text.content.ptr;
  if (local_190.text.content.ptr != (char *)0x0) {
    local_190.text.content.ptr = (char *)0x0;
    local_190.text.content.size_ = 0;
    iVar15 = (**(local_190.text.content.disposer)->_vptr_ArrayDisposer)
                       (local_190.text.content.disposer,pcVar31,1,sVar33,sVar33,0);
    pSVar19 = (StructText *)CONCAT44(extraout_var_22,iVar15);
  }
  pBVar9 = whichName.name.branches.ptr;
  if (whichName.name.branches.ptr != (Branch *)0x0) {
    uVar10 = CONCAT44(whichName.name.branches.size_._4_4_,(undefined4)whichName.name.branches.size_)
    ;
    whichName.name.branches.ptr = (Branch *)0x0;
    whichName.name.branches.size_._0_4_ = 0;
    whichName.name.branches.size_._4_4_ = 0;
    pSVar19 = (StructText *)
              (*(code *)**(undefined8 **)
                          CONCAT44(whichName.name.branches.disposer._4_4_,
                                   whichName.name.branches.disposer._0_4_))
                        ((undefined8 *)
                         CONCAT44(whichName.name.branches.disposer._4_4_,
                                  whichName.name.branches.disposer._0_4_),pBVar9,0x40,uVar10,uVar10,
                         kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar33 = whichName.name.text.content.size_;
  pcVar31 = whichName.name.text.content.ptr;
  if (whichName.name.text.content.ptr != (char *)0x0) {
    whichName.name.text.content.ptr = (char *)0x0;
    whichName.name.text.content.size_ = 0;
    iVar15 = (**(whichName.name.text.content.disposer)->_vptr_ArrayDisposer)
                       (whichName.name.text.content.disposer,pcVar31,1,sVar33,sVar33,0);
    pSVar19 = (StructText *)CONCAT44(extraout_var_23,iVar15);
  }
  sVar33 = defineText.branches.size_;
  pBVar9 = defineText.branches.ptr;
  if (defineText.branches.ptr != (Branch *)0x0) {
    defineText.branches.ptr = (Branch *)0x0;
    defineText.branches.size_ = 0;
    iVar15 = (**(defineText.branches.disposer)->_vptr_ArrayDisposer)
                       (defineText.branches.disposer,pBVar9,0x40,sVar33,sVar33,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pSVar19 = (StructText *)CONCAT44(extraout_var_24,iVar15);
  }
  sVar33 = defineText.text.content.size_;
  pcVar31 = defineText.text.content.ptr;
  if (defineText.text.content.ptr != (char *)0x0) {
    defineText.text.content.ptr = (char *)0x0;
    defineText.text.content.size_ = 0;
    pSVar19 = (StructText *)
              (*(code *)**(undefined8 **)
                          CONCAT44(defineText.text.content.disposer._4_4_,
                                   (int)defineText.text.content.disposer))
                        ((undefined8 *)
                         CONCAT44(defineText.text.content.disposer._4_4_,
                                  (int)defineText.text.content.disposer),pcVar31,1,sVar33,sVar33,0);
  }
  sVar33 = declareText.branches.size_;
  pBVar9 = declareText.branches.ptr;
  if (declareText.branches.ptr != (Branch *)0x0) {
    declareText.branches.ptr = (Branch *)0x0;
    declareText.branches.size_ = 0;
    iVar15 = (**(declareText.branches.disposer)->_vptr_ArrayDisposer)
                       (declareText.branches.disposer,pBVar9,0x40,sVar33,sVar33,
                        kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pSVar19 = (StructText *)CONCAT44(extraout_var_25,iVar15);
  }
  sVar33 = declareText.text.content.size_;
  pcVar31 = declareText.text.content.ptr;
  if (declareText.text.content.ptr != (char *)0x0) {
    declareText.text.content.ptr = (char *)0x0;
    declareText.text.content.size_ = 0;
    iVar15 = (**(declareText.text.content.disposer)->_vptr_ArrayDisposer)
                       (declareText.text.content.disposer,pcVar31,1,sVar33,sVar33,0);
    pSVar19 = (StructText *)CONCAT44(extraout_var_26,iVar15);
  }
  sVar33 = templates.content.size_;
  pcVar31 = templates.content.ptr;
  if (templates.content.ptr != (char *)0x0) {
    templates.content.ptr = (char *)0x0;
    templates.content.size_ = 0;
    iVar15 = (**(templates.content.disposer)->_vptr_ArrayDisposer)
                       (templates.content.disposer,pcVar31,1,sVar33,sVar33,0);
    pSVar19 = (StructText *)CONCAT44(extraout_var_27,iVar15);
  }
  if (firstElement != (size_t *)0x0) {
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement,0xe0,sVar27,
               sVar27,kj::ArrayDisposer::
                      Dispose_<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText,_false>::
                      destruct);
    pSVar19 = extraout_RAX;
  }
  sVar27 = subScope.content.size_;
  pcVar31 = subScope.content.ptr;
  if (subScope.content.ptr != (char *)0x0) {
    subScope.content.ptr = (char *)0x0;
    subScope.content.size_ = 0;
    iVar15 = (**(subScope.content.disposer)->_vptr_ArrayDisposer)
                       (subScope.content.disposer,pcVar31,1,sVar27,sVar27,0);
    pSVar19 = (StructText *)CONCAT44(extraout_var_28,iVar15);
  }
  sVar27 = fullName.content.size_;
  pcVar31 = fullName.content.ptr;
  if (fullName.content.ptr != (char *)0x0) {
    fullName.content.ptr = (char *)0x0;
    fullName.content.size_ = 0;
    iVar15 = (**(fullName.content.disposer)->_vptr_ArrayDisposer)
                       (fullName.content.disposer,pcVar31,1,sVar27,sVar27,0);
    pSVar19 = (StructText *)CONCAT44(extraout_var_29,iVar15);
  }
  return pSVar19;
}

Assistant:

StructText makeStructText(kj::StringPtr scope, kj::StringPtr name, StructSchema schema,
                            kj::Array<kj::StringTree> nestedTypeDecls,
                            const TemplateContext& templateContext) {
    auto proto = schema.getProto();
    KJ_IF_MAYBE(annotatedName, annotationValue(proto, NAME_ANNOTATION_ID)) {
      name = annotatedName->getText();
    }
    auto fullName = kj::str(scope, name, templateContext.args());
    auto subScope = kj::str(fullName, "::");
    auto fieldTexts = KJ_MAP(f, schema.getFields()) {
      return makeFieldText(subScope, f, templateContext);
    };

    auto structNode = proto.getStruct();
    uint discrimOffset = structNode.getDiscriminantOffset();
    auto hexId = kj::hex(proto.getId());

    kj::String templates = kj::str(templateContext.allDecls());  // Ends with a newline

    // Private members struct
    kj::StringTree declareText = kj::strTree(
         "  struct _capnpPrivate {\n"
         "    CAPNP_DECLARE_STRUCT_HEADER(", hexId, ", ", structNode.getDataWordCount(), ", ",
         structNode.getPointerCount(), ")\n");

    kj::StringTree defineText = kj::strTree(
        "// ", fullName, "\n",
        templates, "constexpr uint16_t ", fullName, "::_capnpPrivate::dataWordSize;\n",
        templates, "constexpr uint16_t ", fullName, "::_capnpPrivate::pointerCount;\n"
        "#if !CAPNP_LITE\n",
        templates, "constexpr ::capnp::Kind ", fullName, "::_capnpPrivate::kind;\n",
        templates, "constexpr ::capnp::_::RawSchema const* ", fullName, "::_capnpPrivate::schema;\n");

    if (templateContext.isGeneric()) {
      auto brandInitializers = makeBrandInitializers(templateContext, schema);
      bool hasDeps = (brandInitializers.dependencies.size() != 0);

      declareText = kj::strTree(kj::mv(declareText),
          "    #if !CAPNP_LITE\n",
          makeGenericDeclarations(templateContext, hasDeps),
          "    #endif  // !CAPNP_LITE\n");

      defineText = kj::strTree(kj::mv(defineText),
          makeGenericDefinitions(
              templateContext, fullName, kj::str(hexId), kj::mv(brandInitializers)));
    } else {
      declareText = kj::strTree(kj::mv(declareText),
          "    #if !CAPNP_LITE\n"
          "    static constexpr ::capnp::_::RawBrandedSchema const* brand() { return &schema->defaultBrand; }\n"
          "    #endif  // !CAPNP_LITE\n");
    }

    declareText = kj::strTree(kj::mv(declareText), "  };");
    defineText = kj::strTree(kj::mv(defineText), "#endif  // !CAPNP_LITE\n\n");

    // Name of the ::Which type, when applicable.
    CppTypeName whichName;
    if (structNode.getDiscriminantCount() != 0) {
      whichName = cppFullName(schema, nullptr);
      whichName.addMemberType("Which");
    }

    return StructText {
      kj::strTree(
          templateContext.hasParams() ? "  " : "", templateContext.decl(true),
          "  struct ", name, ";\n"),

      kj::strTree(
          templateContext.parentDecls(),
          templateContext.decl(scope == nullptr),
          "struct ", scope, name, " {\n",
          "  ", name, "() = delete;\n"
          "\n"
          "  class Reader;\n"
          "  class Builder;\n"
          "  class Pipeline;\n",
          structNode.getDiscriminantCount() == 0 ? kj::strTree() : kj::strTree(
              "  enum Which: uint16_t {\n",
              KJ_MAP(f, structNode.getFields()) {
                if (hasDiscriminantValue(f)) {
                  return kj::strTree("    ", toUpperCase(protoName(f)), ",\n");
                } else {
                  return kj::strTree();
                }
              },
              "  };\n"),
          KJ_MAP(n, nestedTypeDecls) { return kj::mv(n); },
          "\n",
          kj::mv(declareText), "\n",
          "};\n"
          "\n"),

      kj::strTree(
          makeReaderDef(fullName, name, templateContext, structNode.getDiscriminantCount() != 0,
                        KJ_MAP(f, fieldTexts) { return kj::mv(f.readerMethodDecls); }),
          makeBuilderDef(fullName, name, templateContext, structNode.getDiscriminantCount() != 0,
                         KJ_MAP(f, fieldTexts) { return kj::mv(f.builderMethodDecls); }),
          makePipelineDef(fullName, name, templateContext, structNode.getDiscriminantCount() != 0,
                          KJ_MAP(f, fieldTexts) { return kj::mv(f.pipelineMethodDecls); })),

      kj::strTree(
          structNode.getDiscriminantCount() == 0 ? kj::strTree() : kj::strTree(
              templateContext.allDecls(),
              "inline ", whichName, " ", fullName, "::Reader::which() const {\n"
              "  return _reader.getDataField<Which>(\n"
              "      ::capnp::bounded<", discrimOffset, ">() * ::capnp::ELEMENTS);\n"
              "}\n",
              templateContext.allDecls(),
              "inline ", whichName, " ", fullName, "::Builder::which() {\n"
              "  return _builder.getDataField<Which>(\n"
              "      ::capnp::bounded<", discrimOffset, ">() * ::capnp::ELEMENTS);\n"
              "}\n"
              "\n"),
          KJ_MAP(f, fieldTexts) { return kj::mv(f.inlineMethodDefs); }),

      kj::mv(defineText)
    };
  }